

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRange.cxx
# Opt level: O2

int testRange(int param_1,char **param_2)

{
  int iVar1;
  __type _Var2;
  ostream *poVar3;
  int *piVar4;
  pointer pbVar5;
  int *piVar6;
  long lVar7;
  difference_type __n;
  pointer piVar8;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator_type local_13d;
  allocator<char> local_13c;
  allocator<char> local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringRange;
  vector<int,_std::allocator<int>_> testData;
  pointer local_108;
  pointer piStack_100;
  size_type local_f8;
  vector<int,_std::allocator<int>_> evenData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined8 local_b8 [4];
  string local_98 [32];
  string local_78 [32];
  string local_58 [40];
  
  local_d8.field_2._M_allocated_capacity = 0x600000005;
  local_d8.field_2._8_8_ = 0x800000007;
  local_d8._M_dataplus._M_p = (pointer)0x200000001;
  local_d8._M_string_length = 0x400000003;
  local_b8[0] = 0xa00000009;
  __l._M_len = 10;
  __l._M_array = (iterator)&local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&testData,__l,(allocator_type *)&stringRange);
  if (testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(!cmMakeRange(testData).empty()) failed on line ");
    iVar1 = 0x16;
  }
  else if ((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start == 0x28) {
    piVar8 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 5;
    if (piVar8 == testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty()) failed on line "
                              );
      iVar1 = 0x19;
    }
    else if ((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar8 == 0x14) {
      if (piVar8 == testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -5) {
        piVar6 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 8;
        for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 0x10) {
          if (*(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7) % 3 == 0) {
            piVar4 = (int *)(lVar7 + (long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
            goto LAB_0013811c;
          }
          if (*(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7 + 4) % 3 == 0) {
            piVar4 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar7 + 4);
            goto LAB_0013811c;
          }
          if (*(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7 + 8) % 3 == 0) {
            piVar4 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar7 + 8);
            goto LAB_0013811c;
          }
          if (*(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7 + 0xc) % 3 == 0) {
            piVar4 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar7 + 0xc);
            goto LAB_0013811c;
          }
        }
        lVar7 = (long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
        piVar4 = piVar6;
        if (lVar7 == 1) {
LAB_001380ef:
          if (*piVar4 % 3 != 0) {
            piVar4 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
LAB_0013811c:
          if (piVar4 != testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 0x10) {
              if (10 < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + lVar7)) {
                piVar4 = (int *)(lVar7 + (long)testData.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start);
                goto LAB_001381c2;
              }
              if (10 < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + lVar7 + 4)) {
                piVar4 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 4);
                goto LAB_001381c2;
              }
              if (10 < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + lVar7 + 8)) {
                piVar4 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 8);
                goto LAB_001381c2;
              }
              if (10 < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + lVar7 + 0xc)) {
                piVar4 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 0xc);
                goto LAB_001381c2;
              }
            }
            lVar7 = (long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
            piVar4 = piVar6;
            if (lVar7 == 1) {
LAB_0013819b:
              if (*piVar4 < 0xb) {
                piVar4 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              }
LAB_001381c2:
              if (piVar4 != testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; })) failed on line "
                                        );
                iVar1 = 0x20;
                goto LAB_0013802d;
              }
            }
            else {
              if (lVar7 == 2) {
LAB_00138192:
                if (*piVar4 < 0xb) {
                  piVar4 = piVar4 + 1;
                  goto LAB_0013819b;
                }
                goto LAB_001381c2;
              }
              if (lVar7 == 3) {
                if (*piVar6 < 0xb) {
                  piVar4 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 9;
                  goto LAB_00138192;
                }
                goto LAB_001381c2;
              }
            }
            for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 0x10) {
              if (0xb < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7)) {
                piVar6 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7);
                goto LAB_00138268;
              }
              if (0xb < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 4)) {
                piVar6 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 4);
                goto LAB_00138268;
              }
              if (0xb < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 8)) {
                piVar6 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 8);
                goto LAB_00138268;
              }
              if (0xb < *(int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 0xc)) {
                piVar6 = (int *)((long)testData.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7 + 0xc);
                goto LAB_00138268;
              }
            }
            lVar7 = (long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
            if (lVar7 == 1) {
LAB_0013823b:
              if (*piVar6 < 0xc) {
                piVar6 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              }
LAB_00138268:
              if (piVar6 != testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; })) failed on line "
                                        );
                iVar1 = 0x21;
                goto LAB_0013802d;
              }
            }
            else {
              if (lVar7 == 2) {
LAB_00138232:
                if (*piVar6 < 0xc) {
                  piVar6 = piVar6 + 1;
                  goto LAB_0013823b;
                }
                goto LAB_00138268;
              }
              if (lVar7 == 3) {
                if (*piVar6 < 0xc) {
                  piVar6 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 9;
                  goto LAB_00138232;
                }
                goto LAB_00138268;
              }
            }
            local_d8._M_dataplus._M_p = (pointer)0x400000002;
            local_d8._M_string_length = 0x800000006;
            local_d8.field_2._M_allocated_capacity._0_4_ = 10;
            __l_00._M_len = 5;
            __l_00._M_array = (iterator)&local_d8;
            std::vector<int,_std::allocator<int>_>::vector
                      (&evenData,__l_00,(allocator_type *)&stringRange);
            piVar8 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            local_d8._M_dataplus._M_p =
                 (pointer)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            local_d8._M_string_length =
                 (size_type)
                 testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            RangeIterators::
            FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Tests/CMakeLib/testRange.cxx:36:3)>
            ::SatisfyPredicate((FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>
                                *)&local_d8);
            stringRange.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)piVar8;
            stringRange.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)piVar8;
            RangeIterators::
            FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Tests/CMakeLib/testRange.cxx:36:3)>
            ::SatisfyPredicate((FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>
                                *)&stringRange);
            pbVar5 = stringRange.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_f8 = local_d8.field_2._M_allocated_capacity;
            local_108 = (pointer)local_d8._M_dataplus._M_p;
            piStack_100 = (pointer)local_d8._M_string_length;
            lVar7 = 0;
            while ((pointer)local_d8._M_dataplus._M_p != pbVar5) {
              RangeIterators::
              FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Tests/CMakeLib/testRange.cxx:36:3)>
              ::operator++((FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>
                            *)&local_d8);
              lVar7 = lVar7 + 1;
            }
            if ((long)evenData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)evenData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2 == lVar7) {
              local_d8.field_2._M_allocated_capacity = local_f8;
              local_d8._M_dataplus._M_p = (pointer)local_108;
              local_d8._M_string_length = (size_type)piStack_100;
              piVar8 = evenData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              while ((pointer)local_d8._M_dataplus._M_p != pbVar5) {
                if (*(int *)local_d8._M_dataplus._M_p != *piVar8) goto LAB_0013835e;
                RangeIterators::
                FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Tests/CMakeLib/testRange.cxx:36:3)>
                ::operator++((FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>
                              *)&local_d8);
                piVar8 = piVar8 + 1;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d8,"1",(allocator<char> *)&local_108);
              std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"2",&local_139);
              std::__cxx11::string::string<std::allocator<char>>(local_98,"3",&local_13a);
              std::__cxx11::string::string<std::allocator<char>>(local_78,"4",&local_13b);
              std::__cxx11::string::string<std::allocator<char>>(local_58,"5",&local_13c);
              __l_01._M_len = 5;
              __l_01._M_array = &local_d8;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&stringRange,__l_01,&local_13d);
              lVar7 = 0x80;
              do {
                std::__cxx11::string::~string((string *)((long)&local_d8._M_dataplus._M_p + lVar7));
                lVar7 = lVar7 + -0x20;
              } while (lVar7 != -0x20);
              if ((ulong)((long)(testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish + -5) -
                         (long)testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2 ==
                  (long)stringRange.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)stringRange.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) {
                pbVar5 = stringRange.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                for (piVar8 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    piVar8 != testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish + -5; piVar8 = piVar8 + 1) {
                  std::__cxx11::to_string(&local_d8,*piVar8);
                  _Var2 = std::operator==(&local_d8,pbVar5);
                  std::__cxx11::string::~string((string *)&local_d8);
                  if (!_Var2) goto LAB_001384b3;
                  pbVar5 = pbVar5 + 1;
                }
              }
              else {
LAB_001384b3:
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(cmMakeRange(testData) .transform([](int n) { return std::to_string(n); }) .retreat(5) == cmMakeRange(stringRange)) failed on line "
                                        );
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
                std::operator<<(poVar3,"\n");
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&stringRange);
            }
            else {
LAB_0013835e:
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) == cmMakeRange(evenData)) failed on line "
                                      );
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
              std::operator<<(poVar3,"\n");
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&evenData.super__Vector_base<int,_std::allocator<int>_>);
            goto LAB_00138045;
          }
        }
        else {
          if (lVar7 == 2) {
LAB_001380e0:
            if (*piVar4 % 3 != 0) {
              piVar4 = piVar4 + 1;
              goto LAB_001380ef;
            }
            goto LAB_0013811c;
          }
          if (lVar7 == 3) {
            if (*piVar6 % 3 != 0) {
              piVar4 = testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 9;
              goto LAB_001380e0;
            }
            goto LAB_0013811c;
          }
        }
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; })) failed on line "
                                );
        iVar1 = 0x1f;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty()) failed on line "
                                );
        iVar1 = 0x1c;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5) failed on line "
                              );
      iVar1 = 0x1a;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(cmMakeRange(testData).size() == 10) failed on line ");
    iVar1 = 0x17;
  }
LAB_0013802d:
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,"\n");
LAB_00138045:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&testData.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int testRange(int /*unused*/, char* /*unused*/ [])
{
  std::vector<int> const testData = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10 };

  ASSERT_TRUE(!cmMakeRange(testData).empty());
  ASSERT_TRUE(cmMakeRange(testData).size() == 10);

  ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5);

  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).size() == 0);

  ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; }));
  ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; }));
  ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; }));

  std::vector<int> const evenData = { 2, 4, 6, 8, 10 };
  ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) ==
              cmMakeRange(evenData));

  std::vector<std::string> const stringRange = { "1", "2", "3", "4", "5" };
  ASSERT_TRUE(cmMakeRange(testData)
                .transform([](int n) { return std::to_string(n); })
                .retreat(5) == cmMakeRange(stringRange));

  return 0;
}